

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall
duckdb::CSVReaderOptions::FromNamedParameters
          (CSVReaderOptions *this,named_parameter_map_t *in,ClientContext *context,
          MultiFileOptions *file_options)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  string loption;
  MultiFileReader local_98;
  CSVReaderOptions *local_68;
  _func_int **local_60;
  MultiFileOptions *local_58;
  string local_50;
  
  p_Var2 = (in->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    local_60 = (_func_int **)&PTR__MultiFileReader_019bdab8;
    local_68 = this;
    local_58 = file_options;
    do {
      StringUtil::Lower(&local_50,(string *)(p_Var2 + 1));
      local_98.function_name.field_2._8_8_ = 0;
      local_98._vptr_MultiFileReader = local_60;
      local_98.function_name._M_dataplus._M_p = (pointer)&local_98.function_name.field_2;
      local_98.function_name._M_string_length = 0;
      local_98.function_name.field_2._M_allocated_capacity = 0;
      bVar1 = MultiFileReader::ParseOption
                        (&local_98,&local_50,(Value *)(p_Var2 + 5),local_58,context);
      MultiFileReader::~MultiFileReader(&local_98);
      if (!bVar1) {
        ParseOption(local_68,context,(string *)(p_Var2 + 1),(Value *)(p_Var2 + 5));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CSVReaderOptions::FromNamedParameters(const named_parameter_map_t &in, ClientContext &context,
                                           MultiFileOptions &file_options) {
	for (auto &kv : in) {
		auto loption = StringUtil::Lower(kv.first);
		if (MultiFileReader().ParseOption(loption, kv.second, file_options, context)) {
			continue;
		}
		ParseOption(context, kv.first, kv.second);
	}
}